

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O1

void __thiscall gvr::Mesh::resizeVertexList(Mesh *this,int vn,bool with_scanprop,bool with_scanpos)

{
  float *pfVar1;
  uint uVar2;
  int iVar3;
  float *pfVar4;
  int iVar5;
  ulong uVar6;
  
  iVar3 = vn * 3;
  uVar6 = 0xffffffffffffffff;
  if (-1 < vn) {
    uVar6 = (long)iVar3 << 2;
  }
  pfVar4 = (float *)operator_new__(uVar6);
  iVar5 = (this->super_PointCloud).n;
  if (vn <= iVar5) {
    iVar5 = vn;
  }
  uVar2 = iVar5 * 3;
  if (0 < iVar5) {
    pfVar1 = this->normal;
    iVar5 = uVar2 + 1;
    uVar6 = (ulong)(uVar2 - 1);
    do {
      pfVar4[uVar6] = pfVar1[uVar6];
      iVar5 = iVar5 + -1;
      uVar6 = uVar6 - 1;
    } while (1 < iVar5);
  }
  if (SBORROW4(uVar2,iVar3) != (int)(uVar2 + vn * -3) < 0) {
    memset(pfVar4 + (int)uVar2,0,(ulong)(iVar3 + ~uVar2) * 4 + 4);
  }
  if (this->normal != (float *)0x0) {
    operator_delete__(this->normal);
  }
  this->normal = pfVar4;
  PointCloud::resizeVertexList(&this->super_PointCloud,vn,with_scanprop,with_scanpos);
  return;
}

Assistant:

void Mesh::resizeVertexList(int vn, bool with_scanprop, bool with_scanpos)
{
  float *p=new float [3*vn];

  for (int i=3*std::min(getVertexCount(), vn)-1; i>=0; i--)
  {
    p[i]=normal[i];
  }

  for (int i=3*std::min(getVertexCount(), vn); i<3*vn; i++)
  {
    p[i]=0;
  }

  delete [] normal;

  normal=p;

  PointCloud::resizeVertexList(vn, with_scanprop, with_scanpos);
}